

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

deInt64 xe::toInt64(char *str)

{
  deInt64 local_1d0;
  deInt64 val;
  allocator<char> local_1b1;
  string local_1b0 [32];
  istringstream local_190 [8];
  istringstream s;
  char *str_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,str,&local_1b1);
  std::__cxx11::istringstream::istringstream(local_190,local_1b0,_S_in);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::istream::operator>>((istream *)local_190,&local_1d0);
  std::__cxx11::istringstream::~istringstream(local_190);
  return local_1d0;
}

Assistant:

static inline deInt64 toInt64 (const char* str)
{
	std::istringstream	s	(str);
	deInt64				val;

	s >> val;

	return val;
}